

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5HashEntry * fts5HashEntryMerge(Fts5HashEntry *pLeft,Fts5HashEntry *pRight)

{
  int iVar1;
  int iVar2;
  Fts5HashEntry *in_RAX;
  Fts5HashEntry *pFVar3;
  int iVar4;
  Fts5HashEntry *pFVar5;
  Fts5HashEntry **ppFVar6;
  Fts5HashEntry *pRet;
  Fts5HashEntry *local_28;
  
  ppFVar6 = &local_28;
  local_28 = in_RAX;
  do {
    *ppFVar6 = (Fts5HashEntry *)0x0;
    pFVar5 = pLeft;
    while( true ) {
      if (pFVar5 == (Fts5HashEntry *)0x0 && pRight == (Fts5HashEntry *)0x0) {
        return local_28;
      }
      pFVar3 = pRight;
      if ((pFVar5 != (Fts5HashEntry *)0x0) && (pFVar3 = pFVar5, pRight != (Fts5HashEntry *)0x0))
      break;
      *ppFVar6 = pFVar3;
      pRight = (Fts5HashEntry *)0x0;
      pFVar5 = (Fts5HashEntry *)0x0;
    }
    iVar4 = pFVar5->nKey;
    iVar1 = pRight->nKey;
    iVar2 = iVar4;
    if (iVar1 <= iVar4) {
      iVar2 = iVar1;
    }
    iVar2 = memcmp(pFVar5 + 1,pRight + 1,(long)iVar2);
    iVar4 = iVar4 - iVar1;
    if (iVar2 != 0) {
      iVar4 = iVar2;
    }
    if (iVar4 < 1) {
      *ppFVar6 = pFVar5;
      pLeft = pFVar5->pScanNext;
      ppFVar6 = &pFVar5->pScanNext;
    }
    else {
      *ppFVar6 = pRight;
      ppFVar6 = &pRight->pScanNext;
      pRight = pRight->pScanNext;
      pLeft = pFVar5;
    }
  } while( true );
}

Assistant:

static Fts5HashEntry *fts5HashEntryMerge(
  Fts5HashEntry *pLeft,
  Fts5HashEntry *pRight
){
  Fts5HashEntry *p1 = pLeft;
  Fts5HashEntry *p2 = pRight;
  Fts5HashEntry *pRet = 0;
  Fts5HashEntry **ppOut = &pRet;

  while( p1 || p2 ){
    if( p1==0 ){
      *ppOut = p2;
      p2 = 0;
    }else if( p2==0 ){
      *ppOut = p1;
      p1 = 0;
    }else{
      char *zKey1 = fts5EntryKey(p1);
      char *zKey2 = fts5EntryKey(p2);
      int nMin = MIN(p1->nKey, p2->nKey);

      int cmp = memcmp(zKey1, zKey2, nMin);
      if( cmp==0 ){
        cmp = p1->nKey - p2->nKey;
      }
      assert( cmp!=0 );

      if( cmp>0 ){
        /* p2 is smaller */
        *ppOut = p2;
        ppOut = &p2->pScanNext;
        p2 = p2->pScanNext;
      }else{
        /* p1 is smaller */
        *ppOut = p1;
        ppOut = &p1->pScanNext;
        p1 = p1->pScanNext;
      }
      *ppOut = 0;
    }
  }

  return pRet;
}